

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O0

void __thiscall Tree::quickSort(Tree *this,int L,int R)

{
  undefined1 local_68 [8];
  Node temp;
  int j;
  int i;
  int R_local;
  int L_local;
  Tree *this_local;
  
  temp.field_1._56_4_ = R;
  temp.field_1._60_4_ = L;
  memcpy(local_68,this->m_queueIndexArray[(L + R) / 2],0x48);
  while ((int)temp.field_1._60_4_ <= (int)temp.field_1._56_4_) {
    while ((this->m_queueIndexArray[(int)temp.field_1._60_4_]->field_1).data.year <
           (short)temp.field_1._52_2_) {
      temp.field_1._60_4_ = temp.field_1._60_4_ + 1;
    }
    while ((short)temp.field_1._52_2_ <
           (this->m_queueIndexArray[(int)temp.field_1._56_4_]->field_1).data.year) {
      temp.field_1._56_4_ = temp.field_1._56_4_ + -1;
    }
    if ((int)temp.field_1._60_4_ <= (int)temp.field_1._56_4_) {
      swapNodes(this->m_queueIndexArray + (int)temp.field_1._60_4_,
                this->m_queueIndexArray + (int)temp.field_1._56_4_);
      temp.field_1._60_4_ = temp.field_1._60_4_ + 1;
      temp.field_1._56_4_ = temp.field_1._56_4_ + -1;
    }
  }
  if (L < (int)temp.field_1._56_4_) {
    quickSort(this,L,temp.field_1._56_4_);
  }
  if ((int)temp.field_1._60_4_ < R) {
    quickSort(this,temp.field_1._60_4_,R);
  }
  return;
}

Assistant:

void quickSort(int L, int R) {
        int i = L;
        int j = R;
        Node temp = *m_queueIndexArray[(i + j) / 2];
        while (i <= j) {
            while ((*m_queueIndexArray[i]).data.year < temp.data.year) {
                i++;
            }
            while ((*m_queueIndexArray[j]).data.year > temp.data.year) {
                j--;
            }
            if (i <= j) {
                swapNodes(&m_queueIndexArray[i], &m_queueIndexArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            quickSort(L, j);
        }
        if (i < R) {
            quickSort(i, R);
        }
    }